

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void aom_yv12_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf,int num_planes)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int plane;
  ulong uVar6;
  
  uVar5 = 0;
  if (0 < num_planes) {
    uVar5 = (ulong)(uint)num_planes;
  }
  if ((ybf->flags & 8) == 0) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = (ulong)(uVar6 != 0);
      iVar4 = ybf->border >> (uVar6 != 0);
      iVar1 = *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x38);
      iVar2 = *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x30);
      extend_plane(ybf->store_buf_adr[uVar6 - 4],
                   *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x28),iVar1,iVar2,iVar4,iVar4,
                   (iVar4 - iVar2) + *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x40),
                   (iVar4 - iVar1) + *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x48),0,iVar2)
      ;
    }
  }
  else {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = (ulong)(uVar6 != 0);
      iVar4 = ybf->border >> (uVar6 != 0);
      iVar1 = *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x38);
      iVar2 = *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x30);
      extend_plane_high(ybf->store_buf_adr[uVar6 - 4],
                        *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x28),iVar1,iVar2,iVar4,
                        iVar4,(iVar4 - iVar2) +
                              *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x40),
                        (iVar4 - iVar1) + *(int *)((long)ybf->store_buf_adr + uVar3 * 4 + -0x48),0,
                        iVar2);
    }
  }
  return;
}

Assistant:

void aom_yv12_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf,
                                     const int num_planes) {
  assert(ybf->border % 2 == 0);
  assert(ybf->y_height - ybf->y_crop_height < 16);
  assert(ybf->y_width - ybf->y_crop_width < 16);
  assert(ybf->y_height - ybf->y_crop_height >= 0);
  assert(ybf->y_width - ybf->y_crop_width >= 0);

#if CONFIG_AV1_HIGHBITDEPTH
  if (ybf->flags & YV12_FLAG_HIGHBITDEPTH) {
    for (int plane = 0; plane < num_planes; ++plane) {
      const int is_uv = plane > 0;
      const int plane_border = ybf->border >> is_uv;
      extend_plane_high(
          ybf->buffers[plane], ybf->strides[is_uv], ybf->crop_widths[is_uv],
          ybf->crop_heights[is_uv], plane_border, plane_border,
          plane_border + ybf->heights[is_uv] - ybf->crop_heights[is_uv],
          plane_border + ybf->widths[is_uv] - ybf->crop_widths[is_uv], 0,
          ybf->crop_heights[is_uv]);
    }
    return;
  }
#endif

  for (int plane = 0; plane < num_planes; ++plane) {
    const int is_uv = plane > 0;
    const int plane_border = ybf->border >> is_uv;
    extend_plane(ybf->buffers[plane], ybf->strides[is_uv],
                 ybf->crop_widths[is_uv], ybf->crop_heights[is_uv],
                 plane_border, plane_border,
                 plane_border + ybf->heights[is_uv] - ybf->crop_heights[is_uv],
                 plane_border + ybf->widths[is_uv] - ybf->crop_widths[is_uv], 0,
                 ybf->crop_heights[is_uv]);
  }
}